

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O0

_Bool pick_and_place_monster
                (chunk *c,loc_conflict grid,wchar_t depth,_Bool sleep,_Bool group_okay,
                uint8_t origin)

{
  monster_group_info group_info;
  _Bool _Var1;
  wchar_t wVar2;
  undefined8 local_40;
  monster_group_info info;
  monster_race *race;
  uint8_t origin_local;
  _Bool group_okay_local;
  _Bool sleep_local;
  wchar_t depth_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  info.player_race = (player_race *)get_mon_num(depth,c->depth);
  memset(&local_40,0,0x10);
  _Var1 = is_night();
  race._3_1_ = sleep;
  if ((_Var1) && (wVar2 = level_topography((int)player->place), wVar2 != L'\0')) {
    race._3_1_ = 1;
  }
  if (info.player_race == (player_race *)0x0) {
    grid_local.x._3_1_ = false;
  }
  else {
    group_info.player_race = (player_race *)info._0_8_;
    group_info.index = (undefined4)local_40;
    group_info.role = local_40._4_4_;
    grid_local.x._3_1_ =
         place_new_monster(c,grid,(monster_race *)info.player_race,(_Bool)(race._3_1_ & 1),
                           group_okay,group_info,origin);
  }
  return grid_local.x._3_1_;
}

Assistant:

bool pick_and_place_monster(struct chunk *c, struct loc grid, int depth,
		bool sleep, bool group_okay, uint8_t origin)
{
	/* Pick a monster race, no specified group */
	struct monster_race *race = get_mon_num(depth, c->depth);
	struct monster_group_info info = { 0, 0, 0 };

	/* Enforce sleep at nighttime in the wilderness */
	if (is_night() && (level_topography(player->place) != TOP_TOWN)) {
		sleep = true;
	}

	if (race) {
		return place_new_monster(c, grid, race, sleep, group_okay, info,
								 origin);
	} else {
		return false;
	}
}